

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isdigit.c
# Opt level: O0

int main(void)

{
  ushort **ppuVar1;
  
  ppuVar1 = __ctype_b_loc();
  if (((*ppuVar1)[0x30] & 0x800) == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isdigit.c, line %d - %s\n"
           ,0x1a,"isdigit( \'0\' )");
  }
  ppuVar1 = __ctype_b_loc();
  if (((*ppuVar1)[0x39] & 0x800) == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isdigit.c, line %d - %s\n"
           ,0x1b,"isdigit( \'9\' )");
  }
  ppuVar1 = __ctype_b_loc();
  if (((*ppuVar1)[0x20] & 0x800) != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isdigit.c, line %d - %s\n"
           ,0x1c,"! isdigit( \' \' )");
  }
  ppuVar1 = __ctype_b_loc();
  if (((*ppuVar1)[0x61] & 0x800) != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isdigit.c, line %d - %s\n"
           ,0x1d,"! isdigit( \'a\' )");
  }
  ppuVar1 = __ctype_b_loc();
  if (((*ppuVar1)[0x40] & 0x800) != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isdigit.c, line %d - %s\n"
           ,0x1e,"! isdigit( \'@\' )");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    TESTCASE( isdigit( '0' ) );
    TESTCASE( isdigit( '9' ) );
    TESTCASE( ! isdigit( ' ' ) );
    TESTCASE( ! isdigit( 'a' ) );
    TESTCASE( ! isdigit( '@' ) );
    return TEST_RESULTS;
}